

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatzinc.cpp
# Opt level: O2

void __thiscall FlatZinc::FlatZincSpace::newIntVar(FlatZincSpace *this,IntVarSpec *vs,string *name)

{
  SetLit *pSVar1;
  pointer piVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  IntVarSL *this_00;
  ulong *puVar6;
  IntVar **ppIVar7;
  ulong uVar8;
  byte bVar9;
  int iVar10;
  int *i;
  size_type __new_size;
  pointer elem;
  reference rVar11;
  uint local_78;
  undefined1 local_58 [40];
  
  uVar4 = this->intVarCount;
  if (uVar4 == (this->iv).sz) {
    __new_size = (size_type)(uVar4 * 2);
    if ((int)uVar4 < 1) {
      __new_size = 1;
    }
    vec<IntVar_*>::growTo(&this->iv,(uint)__new_size);
    std::vector<bool,_std::allocator<bool>_>::resize(&this->iv_introduced,__new_size,false);
  }
  uVar8 = _local_78;
  if (so.use_var_is_introduced == true) {
    bVar9 = (vs->super_VarSpec).introduced;
  }
  else {
    bVar9 = (vs->super_VarSpec).output ^ 1;
  }
  if ((so.introduced_heuristic == true) && ((vs->super_VarSpec).looks_introduced != false)) {
    bVar9 = 1;
  }
  if ((vs->super_VarSpec).alias == true) {
    ppIVar7 = (this->iv).data;
    this_00 = (IntVarSL *)ppIVar7[(uint)(vs->super_VarSpec).i];
    uVar4 = this->intVarCount;
    this->intVarCount = uVar4 + 1;
  }
  else {
    if ((vs->super_VarSpec).assigned == true) {
      uVar3 = _local_78 >> 0x20;
      this_00 = (IntVarSL *)getConstant((uint)uVar3);
      _local_78 = uVar8;
    }
    else if ((vs->domain)._some == true) {
      pSVar1 = (vs->domain)._v;
      if (pSVar1->interval == true) {
        this_00 = (IntVarSL *)::newIntVar(pSVar1->min,pSVar1->max);
        local_58._0_8_ = this_00;
        std::__cxx11::string::string((string *)(local_58 + 8),(string *)name);
        std::
        _Rb_tree<IntVar*,std::pair<IntVar*const,std::__cxx11::string>,std::_Select1st<std::pair<IntVar*const,std::__cxx11::string>>,std::less<IntVar*>,std::allocator<std::pair<IntVar*const,std::__cxx11::string>>>
        ::_M_emplace_unique<std::pair<IntVar*,std::__cxx11::string>>
                  ((_Rb_tree<IntVar*,std::pair<IntVar*const,std::__cxx11::string>,std::_Select1st<std::pair<IntVar*const,std::__cxx11::string>>,std::less<IntVar*>,std::allocator<std::pair<IntVar*const,std::__cxx11::string>>>
                    *)&intVarString_abi_cxx11_,
                   (pair<IntVar_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_58);
        std::__cxx11::string::~string((string *)(local_58 + 8));
      }
      else {
        _local_78 = 0;
        piVar2 = (pSVar1->s).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (elem = (pSVar1->s).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start; elem != piVar2; elem = elem + 1) {
          vec<int>::push((vec<int> *)&local_78,elem);
        }
        std::__sort<int*,__gnu_cxx::__ops::_Iter_less_iter>(0,(_local_78 & 0xffffffff) * 4);
        this_00 = (IntVarSL *)::newIntVar(iRam0000000000000000,*(int *)((ulong)(local_78 - 1) * 4));
        local_58._0_8_ = this_00;
        std::__cxx11::string::string((string *)(local_58 + 8),(string *)name);
        std::
        _Rb_tree<IntVar*,std::pair<IntVar*const,std::__cxx11::string>,std::_Select1st<std::pair<IntVar*const,std::__cxx11::string>>,std::less<IntVar*>,std::allocator<std::pair<IntVar*const,std::__cxx11::string>>>
        ::_M_emplace_unique<std::pair<IntVar*,std::__cxx11::string>>
                  ((_Rb_tree<IntVar*,std::pair<IntVar*const,std::__cxx11::string>,std::_Select1st<std::pair<IntVar*const,std::__cxx11::string>>,std::less<IntVar*>,std::allocator<std::pair<IntVar*const,std::__cxx11::string>>>
                    *)&intVarString_abi_cxx11_,
                   (pair<IntVar_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_58);
        std::__cxx11::string::~string((string *)(local_58 + 8));
        uVar4 = local_78;
        iVar10 = *(int *)((ulong)(local_78 - 1) * 4) - iRam0000000000000000;
        iVar5 = mylog2(local_78);
        if ((iVar10 < (int)(iVar5 * uVar4)) &&
           ((so.eager_limit < (int)local_78 ||
            (*(int *)((ulong)(local_78 - 1) * 4) - iRam0000000000000000 < so.eager_limit)))) {
          iVar5 = (*(this_00->super_IntVar).super_Var.super_Branching._vptr_Branching[0x12])
                            (this_00,&local_78,0,1);
          if ((char)iVar5 == '\0') {
            puts("=====UNSATISFIABLE=====");
            printf("%% Top level failure!\n");
            exit(0);
          }
        }
        else {
          IntVarSL::IntVarSL(this_00,(IntVar *)this_00,(vec<int> *)&local_78);
        }
        free((void *)0x0);
      }
    }
    else {
      this_00 = (IntVarSL *)::newIntVar(-500000000,500000000);
    }
    if ((so.exclude_introduced == true) && (bVar9 != 0)) {
      (this_00->super_IntVar).should_be_learnable = false;
    }
    if ((so.decide_introduced == false) && (bVar9 != 0)) {
      (this_00->super_IntVar).should_be_decidable = false;
    }
    uVar4 = this->intVarCount;
    this->intVarCount = uVar4 + 1;
    ppIVar7 = (this->iv).data;
  }
  ppIVar7[uVar4] = &this_00->super_IntVar;
  rVar11 = std::vector<bool,_std::allocator<bool>_>::operator[]
                     (&this->iv_introduced,(long)(int)uVar4);
  puVar6 = rVar11._M_p;
  if (bVar9 == 0) {
    uVar8 = ~rVar11._M_mask & *puVar6;
  }
  else {
    uVar8 = rVar11._M_mask | *puVar6;
  }
  *puVar6 = uVar8;
  return;
}

Assistant:

void FlatZincSpace::newIntVar(IntVarSpec* vs, const std::string& name) {
	// Resizing of the vectors if required
	if (intVarCount == static_cast<int>(iv.size())) {
		const int newSize = intVarCount > 0 ? 2 * intVarCount : 1;
		iv.growTo(newSize);
		iv_introduced.resize(newSize);
	}
	bool considerIntroduced = false;
	if (so.use_var_is_introduced) {
		considerIntroduced = vs->introduced;
	} else {
		considerIntroduced = !vs->output;
	}
	if (so.introduced_heuristic && vs->looks_introduced) {
		considerIntroduced = true;
	}
	if (vs->alias) {
		iv[intVarCount++] = iv[vs->i];
	} else {
		IntVar* v = nullptr;
		if (vs->assigned) {
			v = getConstant(vs->i);
		} else if (vs->domain()) {
			AST::SetLit* sl = vs->domain.some();
			if (sl->interval) {
				v = ::newIntVar(sl->min, sl->max);
				intVarString.insert(std::pair<IntVar*, std::string>(v, name));
			} else {
				vec<int> d;
				for (const int& i : sl->s) {
					d.push(i);
				}
				std::sort((int*)d, (int*)d + d.size());
				v = ::newIntVar(d[0], d.last());
				intVarString.insert(std::pair<IntVar*, std::string>(v, name));
				if ((d.last() - d[0] >= static_cast<int>(d.size() * mylog2(d.size()))) ||
						(static_cast<int>(d.size()) <= so.eager_limit &&
						 (d.last() - d[0] + 1) > so.eager_limit)) {
					new (v) IntVarSL(*v, d);
				} else {
					if (!v->allowSet(d)) {
						TL_FAIL();
					}
				}
			}
		} else {
			v = ::newIntVar();
		}
		/* std::cerr << "int var: " << intVarCount << " " << v << "\n"; */

		if (so.exclude_introduced && considerIntroduced) {
			v->should_be_learnable = false;
		}
		if (!so.decide_introduced && considerIntroduced) {
			v->should_be_decidable = false;
		}
		iv[intVarCount++] = v;
	}
	iv_introduced[intVarCount - 1] = considerIntroduced;
}